

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void crnlib::
     vector<crnlib::hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
     ::object_mover(void *pDst_void,void *pSrc_void,uint num)

{
  undefined8 uVar1;
  long lVar2;
  raw_node *pSrc;
  bool bVar3;
  
  for (lVar2 = 0; (ulong)num << 4 != lVar2; lVar2 = lVar2 + 0x10) {
    bVar3 = *(char *)((long)pSrc_void + lVar2 + 0xc) != '\0';
    if (bVar3) {
      uVar1 = ((undefined8 *)((long)pSrc_void + lVar2))[1];
      *(undefined8 *)((long)pDst_void + lVar2) = *(undefined8 *)((long)pSrc_void + lVar2);
      ((undefined8 *)((long)pDst_void + lVar2))[1] = uVar1;
    }
    *(bool *)((long)pDst_void + lVar2 + 0xc) = bVar3;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }